

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.cpp
# Opt level: O0

void * ObserverThread(void *pParam)

{
  int *__return_storage_ptr__;
  __suseconds_t _Var1;
  int iVar2;
  BOOL BVar3;
  char *pcVar4;
  interval *piVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  interval *local_1538;
  interval *local_1530;
  double local_1460;
  interval local_1458;
  interval local_1440;
  double local_1428;
  interval local_1420;
  interval local_1408;
  double local_13f0;
  interval local_13e8;
  interval local_13d0;
  double local_13b8;
  interval local_13b0;
  interval local_1398;
  double local_1380;
  interval local_1378;
  interval local_1360;
  double local_1348;
  interval local_1340;
  interval local_1328;
  double local_1310;
  interval local_1308;
  interval local_12f0;
  double local_12d8;
  interval local_12d0;
  interval local_12b8;
  double local_12a0;
  interval local_1298;
  interval local_1280;
  double local_1268;
  interval local_1260;
  interval local_1248;
  double local_1230;
  interval local_1228;
  interval local_1210;
  double local_11f8;
  interval local_11f0;
  interval local_11d8;
  double local_11c0;
  interval local_11b8;
  interval local_11a0;
  double local_1188;
  interval local_1180;
  interval local_1168;
  double local_1150;
  interval local_1148;
  interval local_1130;
  interval local_1118;
  interval local_1100;
  double local_10e8;
  interval local_10e0;
  interval local_10c8;
  interval local_10b0;
  interval local_1098;
  interval local_1080;
  interval local_1068;
  double local_1050;
  interval local_1048;
  interval local_1030;
  double local_1018;
  double local_1010;
  interval local_1008;
  interval local_ff0;
  interval local_fd8;
  interval local_fc0;
  interval local_fa8;
  interval local_f90;
  interval local_f78;
  interval local_f60;
  interval local_f48;
  interval local_f30;
  interval local_f18;
  interval local_f00;
  interval local_ee8;
  interval local_ed0;
  interval local_eb8;
  interval local_ea0;
  interval local_e88;
  interval local_e70;
  interval local_e58;
  double local_e40;
  interval local_e38;
  interval local_e20;
  interval local_e08;
  interval local_df0;
  interval local_dd8;
  interval local_dc0;
  interval local_da8;
  double local_d90;
  interval local_d88;
  interval local_d70;
  double local_d58;
  double local_d50;
  interval local_d48;
  interval local_d30;
  interval local_d18;
  interval local_d00;
  interval local_ce8;
  interval local_cd0;
  interval local_cb8;
  interval local_ca0;
  interval local_c88;
  interval local_c70;
  interval local_c58;
  interval local_c40;
  interval local_c28;
  interval local_c10;
  interval local_bf8;
  interval local_be0;
  interval local_bc8;
  interval local_bb0;
  interval local_b98;
  interval local_b80;
  interval local_b68;
  double local_b50;
  interval local_b48;
  interval local_b30;
  interval local_b18;
  interval local_b00;
  interval local_ae8;
  interval local_ad0;
  interval local_ab8;
  double local_aa0;
  interval local_a98;
  interval local_a80;
  double local_a68;
  double local_a60;
  interval local_a58;
  interval local_a40;
  interval local_a28;
  interval local_a10;
  interval local_9f8;
  interval local_9e0;
  interval local_9c8;
  interval local_9b0;
  interval local_998;
  interval local_980;
  interval local_968;
  interval local_950;
  interval local_938;
  interval local_920;
  interval local_908;
  double local_8f0;
  double local_8e8;
  interval local_8e0;
  double local_8c8;
  interval local_8c0;
  interval local_8a8;
  interval local_890;
  interval local_878;
  interval local_860;
  interval local_848;
  interval local_830;
  interval local_818;
  interval local_800;
  interval local_7e8;
  interval local_7d0;
  double local_7b8;
  interval local_7b0;
  interval local_798;
  interval local_780;
  interval local_768;
  interval local_750;
  interval local_738;
  interval local_720;
  interval local_708;
  interval local_6f0;
  interval local_6d8;
  interval local_6c0;
  interval local_6a8;
  interval local_690;
  interval local_678;
  interval local_660;
  interval local_648;
  interval local_630;
  interval local_618;
  interval local_600;
  interval local_5e8;
  interval local_5d0;
  interval local_5b8;
  box local_5a0;
  box local_590;
  interval local_580;
  interval local_568;
  interval local_550;
  undefined1 local_538 [8];
  box p;
  box pdot;
  interval local_500;
  interval local_4d8;
  undefined1 local_4c0 [8];
  box Vr;
  imatrix R_Euler;
  double local_450;
  interval local_448;
  double local_430;
  interval local_428;
  interval local_410;
  double local_3f8;
  interval local_3f0;
  double local_3d8;
  interval local_3d0;
  interval local_3b8;
  double local_3a0;
  interval local_398;
  double local_380;
  double local_378;
  interval local_370;
  double local_358;
  double local_350;
  interval local_348;
  undefined1 local_330 [8];
  interval omegazhat_prev;
  interval vrxhat_prev;
  interval psihat_prev;
  interval zhat_prev;
  interval yhat_prev;
  interval xhat_prev;
  double local_288;
  interval local_280;
  char local_268 [8];
  char logstatefilename [256];
  FILE *local_160;
  FILE *logstatefile;
  double coghat;
  double headinghat;
  double althat;
  double longhat;
  double lathat;
  double sinfilteredwinddir;
  double cosfilteredwinddir;
  timeval tv;
  double t_epoch;
  double t0;
  double t;
  double dt;
  CHRONO chrono_omegaz;
  CHRONO chrono_v;
  CHRONO chrono;
  void *pParam_local;
  
  t = 0.0;
  t0 = 0.0;
  tv.tv_usec = 0;
  sinfilteredwinddir = 0.0;
  lathat = 0.0;
  longhat = 0.0;
  althat = 0.0;
  headinghat = 0.0;
  local_160 = (FILE *)0x0;
  if (bDisablelogstate == 0) {
    EnterCriticalSection(&strtimeCS);
    pcVar4 = strtimeex_fns();
    sprintf(local_268,"log/logstate_%.64s.csv",pcVar4);
    LeaveCriticalSection(&strtimeCS);
    local_160 = fopen(local_268,"w");
    if (local_160 == (FILE *)0x0) {
      printf("Unable to create log file.\n");
      if (bExit != 0) {
        return (void *)0x0;
      }
      bExit = 1;
      return (void *)0x0;
    }
    fprintf(local_160,
            "t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;EPU1;EPU2;\n"
           );
    fflush(local_160);
  }
  EnterCriticalSection(&StateVariablesCS);
  psitwind = psitwind_med;
  vtwind = vtwind_med;
  sinfilteredwinddir = cos(psitwind_med);
  lathat = sin(psitwind);
  dVar6 = atan2(lathat,sinfilteredwinddir);
  local_288 = fmod_2PI(dVar6);
  interval::interval(&local_280,&local_288);
  interval::operator=((interval *)&psitwindhat,&local_280);
  interval::interval((interval *)&xhat_prev.isEmpty,&vtwind);
  interval::operator=((interval *)&vtwindhat,(interval *)&xhat_prev.isEmpty);
  LeaveCriticalSection(&StateVariablesCS);
  bGPSLocalization = 1;
  bDVLLocalization = 1;
  t0 = 0.0;
  StartChrono((CHRONO *)&chrono_v.Suspended);
  StartChrono((CHRONO *)&chrono_omegaz.Suspended);
  StartChrono((CHRONO *)&dt);
  do {
    uSleep((long)(observerperiod * 1000));
    dVar6 = t0;
    GetTimeElapsedChrono((CHRONO *)&chrono_v.Suspended,&t0);
    t = t0 - dVar6;
    iVar2 = gettimeofday((timeval *)&cosfilteredwinddir,(__timezone_ptr_t)0x0);
    if (iVar2 != 0) {
      cosfilteredwinddir = 0.0;
      tv.tv_sec = 0;
    }
    tv.tv_usec = (__suseconds_t)((double)tv.tv_sec * 1e-06 + (double)(long)cosfilteredwinddir);
    EnterCriticalSection(&StateVariablesCS);
    interval::interval((interval *)&yhat_prev.isEmpty,(interval *)&xhat);
    interval::interval((interval *)&zhat_prev.isEmpty,(interval *)&yhat);
    interval::interval((interval *)&psihat_prev.isEmpty,(interval *)&zhat);
    interval::interval((interval *)&vrxhat_prev.isEmpty,(interval *)&psihat);
    interval::interval((interval *)&omegazhat_prev.isEmpty,(interval *)&vrxhat);
    interval::interval((interval *)local_330,(interval *)&omegazhat);
    local_350 = vc_med - vc_var;
    local_358 = vc_med + vc_var;
    interval::interval(&local_348,&local_350,&local_358);
    interval::operator=((interval *)&vchat,&local_348);
    local_378 = psic_med - psic_var;
    local_380 = psic_med + psic_var;
    interval::interval(&local_370,&local_378,&local_380);
    interval::operator=((interval *)&psichat,&local_370);
    local_3a0 = -hw_var;
    interval::interval(&local_398,&local_3a0,&hw_var);
    interval::operator=((interval *)&hwhat,&local_398);
    dVar9 = sinfilteredwinddir;
    dVar6 = wind_filter_coef;
    dVar7 = 1.0 - wind_filter_coef;
    dVar8 = cos(psitwind);
    dVar12 = lathat;
    dVar10 = wind_filter_coef;
    sinfilteredwinddir = dVar6 * dVar9 + dVar7 * dVar8;
    dVar6 = 1.0 - wind_filter_coef;
    dVar9 = sin(psitwind);
    lathat = dVar10 * dVar12 + dVar6 * dVar9;
    dVar6 = atan2(lathat,sinfilteredwinddir);
    local_3d8 = fmod_2PI(dVar6);
    interval::interval(&local_3d0,&local_3d8);
    local_3f8 = -psitwind_var;
    interval::interval(&local_3f0,&local_3f8,&psitwind_var);
    operator+(&local_3b8,&local_3d0,&local_3f0);
    interval::operator=((interval *)&psitwindhat,&local_3b8);
    dVar6 = wind_filter_coef;
    dVar10 = Center((interval *)&vtwindhat);
    local_430 = dVar6 * dVar10 + (1.0 - wind_filter_coef) * vtwind;
    interval::interval(&local_428,&local_430);
    local_450 = -vtwind_var;
    interval::interval(&local_448,&local_450,&vtwind_var);
    operator+(&local_410,&local_428,&local_448);
    interval::operator=((interval *)&vtwindhat,&local_410);
    if (psi_source == 0) {
LAB_001098d8:
      interval::operator=((interval *)&psihat,(interval *)&psi_ahrs);
    }
    else if (psi_source == 1) {
      if (sog < GPS_SOG_for_valid_COG) {
        local_1538 = (interval *)&psi_ahrs;
      }
      else {
        local_1538 = (interval *)&cog_gps;
      }
      interval::operator=((interval *)&psihat,local_1538);
    }
    else {
      if (psi_source != 2) goto LAB_001098d8;
      if (sog < GPS_SOG_for_valid_COG) {
        local_1530 = (interval *)&psi_ahrs;
      }
      else {
        local_1530 = (interval *)&psi_dvl;
      }
      interval::operator=((interval *)&psihat,local_1530);
    }
    interval::operator=((interval *)&omegaxhat,(interval *)&omegax_ahrs);
    interval::operator=((interval *)&omegayhat,(interval *)&omegay_ahrs);
    interval::operator=((interval *)&accrxhat,(interval *)&accrx_ahrs);
    interval::operator=((interval *)&accryhat,(interval *)&accry_ahrs);
    interval::operator=((interval *)&accrzhat,(interval *)&accrz_ahrs);
    dVar6 = t;
    if ((robid & 0xffU) == 0) {
      if (robid == 0x20000) {
        operator*(&local_998,(interval *)&alphavrxhat,u1 + u2);
        Cos(&local_9b0,(interval *)&psihat);
        operator*(&local_980,&local_998,&local_9b0);
        operator+(&local_968,&local_980,(interval *)&xdotnoise);
        operator*(&local_950,dVar6,&local_968);
        operator+(&local_938,(interval *)&xhat,&local_950);
        interval::operator=((interval *)&xhat,&local_938);
        dVar6 = t;
        operator*(&local_a28,(interval *)&alphavrxhat,u1 + u2);
        Sin(&local_a40,(interval *)&psihat);
        operator*(&local_a10,&local_a28,&local_a40);
        operator+(&local_9f8,&local_a10,(interval *)&ydotnoise);
        operator*(&local_9e0,dVar6,&local_9f8);
        operator+(&local_9c8,(interval *)&yhat,&local_9e0);
        interval::operator=((interval *)&yhat,&local_9c8);
        local_a60 = GPS_low_acc * -5.0;
        local_a68 = GPS_low_acc * 5.0;
        interval::interval(&local_a58,&local_a60,&local_a68);
        interval::operator=((interval *)&zhat,&local_a58);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        operator-(&local_ab8,(interval *)&xhat,(interval *)&yhat_prev.isEmpty);
        dVar6 = Center(&local_ab8);
        dVar6 = sqr(dVar6);
        operator-(&local_ad0,(interval *)&yhat,(interval *)&zhat_prev.isEmpty);
        dVar10 = Center(&local_ad0);
        dVar10 = sqr(dVar10);
        local_aa0 = sqrt(dVar6 + dVar10);
        local_aa0 = local_aa0 / t;
        interval::interval(&local_a98,&local_aa0);
        operator+(&local_a80,&local_a98,(interval *)&vrxdotnoise);
        interval::operator=((interval *)&vrxhat,&local_a80);
        interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
        if ((bGPSLocalization != 0) && (BVar3 = bCheckGNSSOK(), BVar3 != 0)) {
          operator&(&local_ae8,(interval *)&xhat,(interval *)&x_gps);
          interval::operator=((interval *)&xhat,&local_ae8);
          operator&(&local_b00,(interval *)&yhat,(interval *)&y_gps);
          interval::operator=((interval *)&yhat,&local_b00);
          operator&(&local_b18,(interval *)&zhat,(interval *)&z_gps);
          interval::operator=((interval *)&zhat,&local_b18);
          if ((((byte)xhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 1) != 0) ||
             (((byte)yhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage & 1) != 0)) {
            interval::operator=((interval *)&xhat,(interval *)&x_gps);
            interval::operator=((interval *)&yhat,(interval *)&y_gps);
          }
          if (((byte)zhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage & 1) != 0) {
            interval::operator=((interval *)&zhat,(interval *)&z_gps);
          }
        }
      }
      else if (robid == 0x200) {
        interval::operator=((interval *)&xhat,(interval *)&x_gps);
        interval::operator=((interval *)&yhat,(interval *)&y_gps);
        interval::operator=((interval *)&zhat,(interval *)&z_gps);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        operator-(&local_b68,(interval *)&xhat,(interval *)&yhat_prev.isEmpty);
        dVar6 = Center(&local_b68);
        dVar6 = sqr(dVar6);
        operator-(&local_b80,(interval *)&yhat,(interval *)&zhat_prev.isEmpty);
        dVar10 = Center(&local_b80);
        dVar10 = sqr(dVar10);
        local_b50 = sqrt(dVar6 + dVar10);
        local_b50 = local_b50 / t;
        interval::interval(&local_b48,&local_b50);
        operator+(&local_b30,&local_b48,(interval *)&vrxdotnoise);
        interval::operator=((interval *)&vrxhat,&local_b30);
        interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
      }
      else if ((robid == 0x100000) || (robid == 0x200000)) {
        operator*(&local_c10,(interval *)&alphavrxhat,u_f);
        Cos(&local_c28,(interval *)&psihat);
        operator*(&local_bf8,&local_c10,&local_c28);
        operator*(&local_c58,(interval *)&alphaomegazhat,uw_f);
        Cos(&local_c40,&local_c58);
        operator*(&local_be0,&local_bf8,&local_c40);
        operator+(&local_bc8,&local_be0,(interval *)&xdotnoise);
        operator*(&local_bb0,dVar6,&local_bc8);
        operator+(&local_b98,(interval *)&xhat,&local_bb0);
        interval::operator=((interval *)&xhat,&local_b98);
        dVar6 = t;
        operator*(&local_ce8,(interval *)&alphavrxhat,u_f);
        Sin(&local_d00,(interval *)&psihat);
        operator*(&local_cd0,&local_ce8,&local_d00);
        operator*(&local_d30,(interval *)&alphaomegazhat,uw_f);
        Cos(&local_d18,&local_d30);
        operator*(&local_cb8,&local_cd0,&local_d18);
        operator+(&local_ca0,&local_cb8,(interval *)&ydotnoise);
        operator*(&local_c88,dVar6,&local_ca0);
        operator+(&local_c70,(interval *)&yhat,&local_c88);
        interval::operator=((interval *)&yhat,&local_c70);
        local_d50 = GPS_low_acc * -5.0;
        local_d58 = GPS_low_acc * 5.0;
        interval::interval(&local_d48,&local_d50,&local_d58);
        interval::operator=((interval *)&zhat,&local_d48);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        operator-(&local_da8,(interval *)&xhat,(interval *)&yhat_prev.isEmpty);
        dVar6 = Center(&local_da8);
        dVar6 = sqr(dVar6);
        operator-(&local_dc0,(interval *)&yhat,(interval *)&zhat_prev.isEmpty);
        dVar10 = Center(&local_dc0);
        dVar10 = sqr(dVar10);
        local_d90 = sqrt(dVar6 + dVar10);
        local_d90 = local_d90 / t;
        interval::interval(&local_d88,&local_d90);
        operator+(&local_d70,&local_d88,(interval *)&vrxdotnoise);
        interval::operator=((interval *)&vrxhat,&local_d70);
        interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
        if ((bGPSLocalization != 0) && (BVar3 = bCheckGNSSOK(), BVar3 != 0)) {
          operator&(&local_dd8,(interval *)&xhat,(interval *)&x_gps);
          interval::operator=((interval *)&xhat,&local_dd8);
          operator&(&local_df0,(interval *)&yhat,(interval *)&y_gps);
          interval::operator=((interval *)&yhat,&local_df0);
          operator&(&local_e08,(interval *)&zhat,(interval *)&z_gps);
          interval::operator=((interval *)&zhat,&local_e08);
          if ((((byte)xhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 1) != 0) ||
             (((byte)yhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage & 1) != 0)) {
            interval::operator=((interval *)&xhat,(interval *)&x_gps);
            interval::operator=((interval *)&yhat,(interval *)&y_gps);
          }
          if (((byte)zhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage & 1) != 0) {
            interval::operator=((interval *)&zhat,(interval *)&z_gps);
          }
        }
      }
      else if ((robid == 0x100) || (robid == 0x400)) {
        interval::operator=((interval *)&xhat,(interval *)&x_gps);
        interval::operator=((interval *)&yhat,(interval *)&y_gps);
        interval::operator=((interval *)&zhat,(interval *)&z_gps);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        operator-(&local_e58,(interval *)&xhat,(interval *)&yhat_prev.isEmpty);
        dVar6 = Center(&local_e58);
        dVar6 = sqr(dVar6);
        operator-(&local_e70,(interval *)&yhat,(interval *)&zhat_prev.isEmpty);
        dVar10 = Center(&local_e70);
        dVar10 = sqr(dVar10);
        local_e40 = sqrt(dVar6 + dVar10);
        local_e40 = local_e40 / t;
        interval::interval(&local_e38,&local_e40);
        operator+(&local_e20,&local_e38,(interval *)&vrxdotnoise);
        interval::operator=((interval *)&vrxhat,&local_e20);
        interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
      }
      else if (robid == 0x4000000) {
        interval::operator=((interval *)&vrxhat,(interval *)&vrx_of);
        interval::operator=((interval *)&vryhat,(interval *)&vry_of);
        dVar6 = t;
        Cos(&local_f00,(interval *)&psihat);
        operator*(&local_ee8,(interval *)&vrx_of,&local_f00);
        Sin(&local_f30,(interval *)&psihat);
        operator*(&local_f18,(interval *)&vry_of,&local_f30);
        operator-(&local_ed0,&local_ee8,&local_f18);
        operator+(&local_eb8,&local_ed0,(interval *)&xdotnoise);
        operator*(&local_ea0,dVar6,&local_eb8);
        operator+(&local_e88,(interval *)&xhat,&local_ea0);
        interval::operator=((interval *)&xhat,&local_e88);
        dVar6 = t;
        Sin(&local_fc0,(interval *)&psihat);
        operator*(&local_fa8,(interval *)&vrx_of,&local_fc0);
        Cos(&local_ff0,(interval *)&psihat);
        operator*(&local_fd8,(interval *)&vry_of,&local_ff0);
        operator+(&local_f90,&local_fa8,&local_fd8);
        operator+(&local_f78,&local_f90,(interval *)&ydotnoise);
        operator*(&local_f60,dVar6,&local_f78);
        operator+(&local_f48,(interval *)&yhat,&local_f60);
        interval::operator=((interval *)&yhat,&local_f48);
        local_1010 = GPS_low_acc * -5.0;
        local_1018 = GPS_low_acc * 5.0;
        interval::interval(&local_1008,&local_1010,&local_1018);
        interval::operator=((interval *)&zhat,&local_1008);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        operator-(&local_1068,(interval *)&zhat,(interval *)&psihat_prev.isEmpty);
        local_1050 = Center(&local_1068);
        local_1050 = local_1050 / t;
        interval::interval(&local_1048,&local_1050);
        operator+(&local_1030,&local_1048,(interval *)&vrzdotnoise);
        interval::operator=((interval *)&vrzhat,&local_1030);
        interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
        if ((bGPSLocalization != 0) && (BVar3 = bCheckGNSSOK(), BVar3 != 0)) {
          operator&(&local_1080,(interval *)&xhat,(interval *)&x_gps);
          interval::operator=((interval *)&xhat,&local_1080);
          operator&(&local_1098,(interval *)&yhat,(interval *)&y_gps);
          interval::operator=((interval *)&yhat,&local_1098);
          operator&(&local_10b0,(interval *)&zhat,(interval *)&z_gps);
          interval::operator=((interval *)&zhat,&local_10b0);
          if ((((byte)xhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 1) != 0) ||
             (((byte)yhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage & 1) != 0)) {
            interval::operator=((interval *)&xhat,(interval *)&x_gps);
            interval::operator=((interval *)&yhat,(interval *)&y_gps);
          }
          if (((byte)zhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage & 1) != 0) {
            interval::operator=((interval *)&zhat,(interval *)&z_gps);
          }
        }
      }
      else {
        interval::operator=((interval *)&xhat,(interval *)&x_gps);
        interval::operator=((interval *)&yhat,(interval *)&y_gps);
        interval::operator=((interval *)&zhat,(interval *)&z_gps);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        operator-(&local_1100,(interval *)&xhat,(interval *)&yhat_prev.isEmpty);
        dVar6 = Center(&local_1100);
        dVar6 = sqr(dVar6);
        operator-(&local_1118,(interval *)&yhat,(interval *)&zhat_prev.isEmpty);
        dVar10 = Center(&local_1118);
        dVar10 = sqr(dVar10);
        local_10e8 = sqrt(dVar6 + dVar10);
        local_10e8 = local_10e8 / t;
        interval::interval(&local_10e0,&local_10e8);
        operator+(&local_10c8,&local_10e0,(interval *)&vrxdotnoise);
        interval::operator=((interval *)&vrxhat,&local_10c8);
        interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
      }
    }
    else {
      if (((bDVLLocalization == 0) || (dVar6 = Width((interval *)&vrx_dvl), dvl_acc * 4.0 < dVar6))
         || (dVar6 = Width((interval *)&vry_dvl), dvl_acc * 4.0 < dVar6)) {
        dVar6 = t;
        Cos(&local_630,(interval *)&psihat);
        operator*(&local_618,(interval *)&vrxhat,&local_630);
        Cos(&local_660,(interval *)&psichat);
        operator*(&local_648,(interval *)&vchat,&local_660);
        operator+(&local_600,&local_618,&local_648);
        operator+(&local_5e8,&local_600,(interval *)&xdotnoise);
        operator*(&local_5d0,dVar6,&local_5e8);
        operator+(&local_5b8,(interval *)&xhat,&local_5d0);
        interval::operator=((interval *)&xhat,&local_5b8);
        dVar6 = t;
        Sin(&local_6f0,(interval *)&psihat);
        operator*(&local_6d8,(interval *)&vrxhat,&local_6f0);
        Sin(&local_720,(interval *)&psichat);
        operator*(&local_708,(interval *)&vchat,&local_720);
        operator+(&local_6c0,&local_6d8,&local_708);
        operator+(&local_6a8,&local_6c0,(interval *)&ydotnoise);
        operator*(&local_690,dVar6,&local_6a8);
        operator+(&local_678,(interval *)&yhat,&local_690);
        interval::operator=((interval *)&yhat,&local_678);
        operator+(&local_738,(interval *)&z_pressure,(interval *)&hwhat);
        interval::operator=((interval *)&zhat,&local_738);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        local_7b8 = 1.0;
        interval::interval(&local_7b0,&local_7b8);
        operator*(&local_7d0,t,(interval *)&alphafvrxhat);
        operator-(&local_798,&local_7b0,&local_7d0);
        operator*(&local_780,&local_798,(interval *)&vrxhat);
        operator*(&local_7e8,t * (u1 + u2),(interval *)&alphavrxhat);
        operator+(&local_768,&local_780,&local_7e8);
        operator*(&local_800,t,(interval *)&vrxdotnoise);
        operator+(&local_750,&local_768,&local_800);
        interval::operator=((interval *)&vrxhat,&local_750);
      }
      else {
        interval::operator=((interval *)&vrxhat,(interval *)&vrx_dvl);
        interval::operator=((interval *)&vryhat,(interval *)&vry_dvl);
        interval::operator=((interval *)&vrzhat,(interval *)&vrz_dvl);
        __return_storage_ptr__ = &R_Euler.data.m_;
        operator+((interval *)__return_storage_ptr__,(interval *)&z_pressure,(interval *)&hwhat);
        interval::operator=((interval *)&zhat,(interval *)__return_storage_ptr__);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        RotationPhiThetaPsi((imatrix *)&Vr.dim,(interval *)&phihat,(interval *)&thetahat,
                            (interval *)&psihat);
        interval::interval(&local_4d8,(interval *)&vrxhat);
        interval::interval(&local_500,(interval *)&vryhat);
        interval::interval((interval *)&pdot.dim,(interval *)&vrzhat);
        box::box((box *)local_4c0,(vector<interval,_std::allocator<interval>_> *)&local_4d8,
                 (vector<interval,_std::allocator<interval>_> *)&local_500,
                 (vector<interval,_std::allocator<interval>_> *)&pdot.dim);
        operator*((imatrix *)&p.dim,(box *)&Vr.dim);
        interval::interval(&local_550,(interval *)&xhat);
        interval::interval(&local_568,(interval *)&yhat);
        interval::interval(&local_580,(interval *)&zhat);
        box::box((box *)local_538,(vector<interval,_std::allocator<interval>_> *)&local_550,
                 (vector<interval,_std::allocator<interval>_> *)&local_568,
                 (vector<interval,_std::allocator<interval>_> *)&local_580);
        operator*(t,&local_5a0);
        operator+(&local_590,(box *)local_538);
        box::operator=((box *)local_538,&local_590);
        box::~box(&local_590);
        box::~box(&local_5a0);
        piVar5 = box::operator[]((box *)local_538,1);
        interval::operator=((interval *)&xhat,piVar5);
        piVar5 = box::operator[]((box *)local_538,2);
        interval::operator=((interval *)&yhat,piVar5);
        box::~box((box *)local_538);
        box::~box((box *)&p.dim);
        box::~box((box *)local_4c0);
        imatrix::~imatrix((imatrix *)&Vr.dim);
      }
      dVar6 = t;
      if ((((robid & 0xeU) == 0) && (robid != 0x40)) && (robid != 0x80)) {
        if (robid == 1) {
          operator*(&local_848,u1 - u2,(interval *)&alphaomegazhat);
          operator+(&local_830,&local_848,(interval *)&psidotnoise);
          operator*(&local_818,dVar6,&local_830);
          interval::operator=((interval *)&omegazhat,&local_818);
        }
        else {
          operator*(&local_878,0.8,(interval *)&omegazhat);
          dVar6 = Center((interval *)&psihat);
          dVar10 = Center((interval *)&vrxhat_prev.isEmpty);
          local_8c8 = sin(dVar6 - dVar10);
          local_8c8 = local_8c8 / t;
          interval::interval(&local_8c0,&local_8c8);
          local_8e8 = -omegaz_ahrs_acc;
          local_8f0 = omegaz_ahrs_acc;
          interval::interval(&local_8e0,&local_8e8,&local_8f0);
          operator+(&local_8a8,&local_8c0,&local_8e0);
          operator*(&local_890,0.2,&local_8a8);
          operator+(&local_860,&local_878,&local_890);
          interval::operator=((interval *)&omegazhat,&local_860);
        }
      }
      else {
        interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
      }
      if (((bGPSLocalization != 0) && (BVar3 = bCheckGNSSOK(), BVar3 != 0)) &&
         (dVar6 = Center((interval *)&zhat), GPS_submarine_depth_limit < dVar6)) {
        operator&(&local_908,(interval *)&xhat,(interval *)&x_gps);
        interval::operator=((interval *)&xhat,&local_908);
        operator&(&local_920,(interval *)&yhat,(interval *)&y_gps);
        interval::operator=((interval *)&yhat,&local_920);
        if ((((byte)xhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage & 1) != 0) ||
           (((byte)yhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage & 1) != 0)) {
          interval::operator=((interval *)&xhat,(interval *)&x_gps);
          interval::operator=((interval *)&yhat,(interval *)&y_gps);
        }
      }
    }
    dVar9 = alt_env;
    dVar12 = long_env;
    dVar10 = lat_env;
    dVar6 = angle_env;
    dVar7 = Center((interval *)&xhat);
    dVar8 = Center((interval *)&yhat);
    dVar11 = Center((interval *)&zhat);
    EnvCoordSystem2GPS(dVar10,dVar12,dVar9,dVar6,dVar7,dVar8,dVar11,&longhat,&althat,&headinghat);
    dVar6 = -angle_env;
    dVar10 = Center((interval *)&psihat);
    dVar6 = fmod_360_pos_rad2deg((dVar6 - dVar10) + 1.5707963267948966);
    dVar10 = -angle_env;
    dVar12 = Center((interval *)&cog_gps);
    dVar10 = fmod_360_pos_rad2deg((dVar10 - dVar12) + 1.5707963267948966);
    if (((robid - 1U < 2) || (robid == 4)) || (robid == 0x20)) {
      if ((vbat1 != 0.0) || (dVar12 = P_electronics_4, NAN(vbat1))) {
        dVar12 = vbat1_filtered * ibat1_filtered;
      }
      EPU1 = (t * dVar12) / 3600.0 + EPU1;
      if ((vbat2 != 0.0) || (NAN(vbat2))) {
        dVar12 = vbat2_filtered * ibat2_filtered;
      }
      else {
        dVar12 = (u1 + u2 + u3) * P_actuators_1 + P_actuators_4;
      }
      EPU2 = (t * dVar12) / 3600.0 + EPU2;
    }
    else if (robid == 0x100) {
LAB_0010b9f5:
      if ((vbat1 != 0.0) || (dVar12 = P_electronics_4, NAN(vbat1))) {
        dVar12 = vbat1_filtered * ibat1_filtered;
      }
      EPU1 = (t * dVar12) / 3600.0 + EPU1;
      if ((vbat2 != 0.0) || (NAN(vbat2))) {
        dVar12 = vbat2_filtered * ibat2_filtered;
      }
      else {
        dVar12 = u_f * P_actuators_1 + uw_f * P_actuators_2 + P_actuators_4;
      }
      EPU2 = (t * dVar12) / 3600.0 + EPU2;
    }
    else if (robid == 0x200) {
LAB_0010bb58:
      if ((vbat1 != 0.0) || (dVar12 = P_electronics_4, NAN(vbat1))) {
        dVar12 = vbat1_filtered * ibat1_filtered;
      }
      EPU1 = (t * dVar12) / 3600.0 + EPU1;
      if ((vbat2 != 0.0) || (NAN(vbat2))) {
        dVar12 = vbat2_filtered * ibat2_filtered;
      }
      else {
        dVar12 = (u1 + u2) * P_actuators_1 + P_actuators_4;
      }
      EPU2 = (t * dVar12) / 3600.0 + EPU2;
    }
    else {
      if (robid == 0x400) goto LAB_0010b9f5;
      if (robid == 0x1000) {
LAB_0010b8ca:
        if ((vbat1 != 0.0) || (dVar12 = P_electronics_4, NAN(vbat1))) {
          dVar12 = vbat1_filtered * ibat1_filtered;
        }
        EPU1 = (t * dVar12) / 3600.0 + EPU1;
        if ((vbat2 != 0.0) || (dVar12 = P_actuators_4, NAN(vbat2))) {
          dVar12 = vbat2_filtered * ibat2_filtered;
        }
        EPU2 = (t * dVar12) / 3600.0 + EPU2;
      }
      else if (robid == 0x2000) {
        if ((vbat1 != 0.0) || (NAN(vbat1))) {
          dVar12 = vbat1_filtered * ibat1_filtered;
        }
        else {
          dVar12 = P_electronics_4 + P_actuators_4;
        }
        EPU1 = (t * dVar12) / 3600.0 + EPU1;
      }
      else {
        if ((robid == 0x4000) || (robid == 0x8000)) goto LAB_0010b8ca;
        if ((robid == 0x10000) || (robid == 0x20000)) goto LAB_0010bb58;
        if ((robid == 0x100000) || (robid == 0x200000)) goto LAB_0010b9f5;
        if ((vbat1 != 0.0) || (dVar12 = P_electronics_4, NAN(vbat1))) {
          dVar12 = vbat1_filtered * ibat1_filtered;
        }
        EPU1 = (t * dVar12) / 3600.0 + EPU1;
        if ((vbat2 != 0.0) || (NAN(vbat2))) {
          dVar12 = vbat2_filtered * ibat2_filtered;
        }
        else {
          dVar12 = (u_f + uw_f + uv_f + ul_f) * P_actuators_1 + P_actuators_4;
        }
        EPU2 = (t * dVar12) / 3600.0 + EPU2;
      }
    }
    if ((((robid == 0x200) || (robid == 0x400)) || (robid == 0x2000)) ||
       ((robid == 0x4000 || (robid == 0x8000)))) {
      fluiddira = fmod_360_rad2deg(1.5707963267948966 - psiawind);
      fluidspeeda = vawind;
      dVar12 = Center((interval *)&psitwindhat);
      fluiddir = fmod_360_rad2deg(1.5707963267948966 - dVar12);
      fluidspeed = Center((interval *)&vtwindhat);
    }
    _Var1 = tv.tv_usec;
    dVar11 = longhat;
    dVar8 = althat;
    dVar7 = headinghat;
    dVar9 = altitude_AGL;
    dVar12 = sog;
    if (local_160 != (FILE *)0x0) {
      fmod_360_rad2deg(alpha_mes);
      Center((interval *)&xhat);
      Center((interval *)&yhat);
      Center((interval *)&zhat);
      Center((interval *)&phihat);
      Center((interval *)&thetahat);
      Center((interval *)&psihat);
      Center((interval *)&vrxhat);
      Center((interval *)&vryhat);
      Center((interval *)&vrzhat);
      Center((interval *)&omegaxhat);
      Center((interval *)&omegayhat);
      Center((interval *)&omegazhat);
      Center((interval *)&accrxhat);
      Center((interval *)&accryhat);
      Center((interval *)&accrzhat);
      local_1150 = 2.0;
      interval::interval(&local_1148,&local_1150);
      operator/(&local_1130,(interval *)&xhat,&local_1148);
      Width(&local_1130);
      local_1188 = 2.0;
      interval::interval(&local_1180,&local_1188);
      operator/(&local_1168,(interval *)&yhat,&local_1180);
      Width(&local_1168);
      local_11c0 = 2.0;
      interval::interval(&local_11b8,&local_11c0);
      operator/(&local_11a0,(interval *)&zhat,&local_11b8);
      Width(&local_11a0);
      local_11f8 = 2.0;
      interval::interval(&local_11f0,&local_11f8);
      operator/(&local_11d8,(interval *)&phihat,&local_11f0);
      Width(&local_11d8);
      local_1230 = 2.0;
      interval::interval(&local_1228,&local_1230);
      operator/(&local_1210,(interval *)&thetahat,&local_1228);
      Width(&local_1210);
      local_1268 = 2.0;
      interval::interval(&local_1260,&local_1268);
      operator/(&local_1248,(interval *)&psihat,&local_1260);
      Width(&local_1248);
      local_12a0 = 2.0;
      interval::interval(&local_1298,&local_12a0);
      operator/(&local_1280,(interval *)&vrxhat,&local_1298);
      Width(&local_1280);
      local_12d8 = 2.0;
      interval::interval(&local_12d0,&local_12d8);
      operator/(&local_12b8,(interval *)&vryhat,&local_12d0);
      Width(&local_12b8);
      local_1310 = 2.0;
      interval::interval(&local_1308,&local_1310);
      operator/(&local_12f0,(interval *)&vrzhat,&local_1308);
      Width(&local_12f0);
      local_1348 = 2.0;
      interval::interval(&local_1340,&local_1348);
      operator/(&local_1328,(interval *)&omegaxhat,&local_1340);
      Width(&local_1328);
      local_1380 = 2.0;
      interval::interval(&local_1378,&local_1380);
      operator/(&local_1360,(interval *)&omegayhat,&local_1378);
      Width(&local_1360);
      local_13b8 = 2.0;
      interval::interval(&local_13b0,&local_13b8);
      operator/(&local_1398,(interval *)&omegazhat,&local_13b0);
      Width(&local_1398);
      local_13f0 = 2.0;
      interval::interval(&local_13e8,&local_13f0);
      operator/(&local_13d0,(interval *)&accrxhat,&local_13e8);
      Width(&local_13d0);
      local_1428 = 2.0;
      interval::interval(&local_1420,&local_1428);
      operator/(&local_1408,(interval *)&accryhat,&local_1420);
      Width(&local_1408);
      local_1460 = 2.0;
      interval::interval(&local_1458,&local_1460);
      operator/(&local_1440,(interval *)&accrzhat,&local_1458);
      Width(&local_1440);
      fprintf(local_160,
              "%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;\n"
              ,_Var1,SUB84(dVar11,0),dVar8,dVar7,dVar6,dVar10,dVar12,dVar9);
      fflush(local_160);
    }
    LeaveCriticalSection(&StateVariablesCS);
    if (bExit != 0) {
      StopChronoQuick((CHRONO *)&dt);
      StopChronoQuick((CHRONO *)&chrono_omegaz.Suspended);
      StopChrono((CHRONO *)&chrono_v.Suspended,&t0);
      if (local_160 != (FILE *)0x0) {
        fclose(local_160);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE ObserverThread(void* pParam)
{
	CHRONO chrono;
	CHRONO chrono_v;
	CHRONO chrono_omegaz;
	double dt = 0, t = 0, t0 = 0, t_epoch = 0;
	struct timeval tv;
	//double dt_chrono = 0;
	//interval xhat_prev_old, yhat_prev_old, psihat_prev_old;
	double cosfilteredwinddir = 0, sinfilteredwinddir = 0;
	double lathat = 0, longhat = 0, althat = 0, headinghat = 0, coghat = 0;

	FILE* logstatefile = NULL;
	char logstatefilename[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	if (!bDisablelogstate)
	{
		EnterCriticalSection(&strtimeCS);
		sprintf(logstatefilename, LOG_FOLDER"logstate_%.64s.csv", strtimeex_fns());
		LeaveCriticalSection(&strtimeCS);
		logstatefile = fopen(logstatefilename, "w");
		if (logstatefile == NULL)
		{
			printf("Unable to create log file.\n");
			if (!bExit) bExit = TRUE; // Unexpected program exit...
			return 0;
		}

		fprintf(logstatefile,
			"t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);"
			"t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;"
			"xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;"
			"wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;"
			"uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;"
			"EPU1;EPU2;\n"
		);
		fflush(logstatefile);
	}

	EnterCriticalSection(&StateVariablesCS);
	psitwind = psitwind_med;
	vtwind = vtwind_med;

	// Initialize wind data filter. Should take some time before getting a correct value...
	cosfilteredwinddir = cos(psitwind);
	sinfilteredwinddir = sin(psitwind);
	psitwindhat = fmod_2PI(atan2(sinfilteredwinddir,cosfilteredwinddir));
	vtwindhat = vtwind;
	LeaveCriticalSection(&StateVariablesCS);

	// GPS localization enabled by default, use enable/disableautogpslocalization commands to enable/disable...
	bGPSLocalization = TRUE;

	// DVL localization enabled by default, use enable/disableautodvllocalization commands to enable/disable...
	bDVLLocalization = TRUE;

	t = 0;

	StartChrono(&chrono);
	StartChrono(&chrono_v);
	StartChrono(&chrono_omegaz);

	for (;;)
	{
		uSleep(1000*observerperiod);
		t0 = t;
		GetTimeElapsedChrono(&chrono, &t);
		dt = t-t0;

		//printf("ObserverThread period : %f s.\n", dt);

		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		t_epoch = tv.tv_sec+0.000001*tv.tv_usec;
		//utc = 1000.0*tv.tv_sec+0.001*tv.tv_usec;

		EnterCriticalSection(&StateVariablesCS);

		interval xhat_prev = xhat;
		interval yhat_prev = yhat;
		interval zhat_prev = zhat;
		interval psihat_prev = psihat;
		interval vrxhat_prev = vrxhat;
		interval omegazhat_prev = omegazhat;

		vchat = interval(vc_med-vc_var,vc_med+vc_var);
		psichat = interval(psic_med-psic_var,psic_med+psic_var);
		hwhat = interval(-hw_var,hw_var);

		// Wind data filter.
		cosfilteredwinddir = wind_filter_coef*cosfilteredwinddir+(1.0-wind_filter_coef)*cos(psitwind);
		sinfilteredwinddir = wind_filter_coef*sinfilteredwinddir+(1.0-wind_filter_coef)*sin(psitwind);
		psitwindhat = fmod_2PI(atan2(sinfilteredwinddir,cosfilteredwinddir))+interval(-psitwind_var,psitwind_var); // Bounds might go outside modulo...
		vtwindhat = wind_filter_coef*Center(vtwindhat)+(1.0-wind_filter_coef)*vtwind+interval(-vtwind_var,vtwind_var);

		// Temporary...
		switch (psi_source)
		{
		case 2:
			psihat = (sog >= GPS_SOG_for_valid_COG)? psi_dvl: psi_ahrs; // Temp...
			break;
		case 1:
			psihat = (sog >= GPS_SOG_for_valid_COG)? cog_gps: psi_ahrs;
			break;
		case 0:
		default:
			psihat = psi_ahrs;
			break;
		}
		omegaxhat = omegax_ahrs;
		omegayhat = omegay_ahrs;
		//omegazhat = omegaz_ahrs;
		accrxhat = accrx_ahrs;
		accryhat = accry_ahrs;
		accrzhat = accrz_ahrs;

		if (robid & SUBMARINE_ROBID_MASK)
		{
			if ((bDVLLocalization)&&((Width(vrx_dvl) <= 4*dvl_acc)&&(Width(vry_dvl) <= 4*dvl_acc)))
			{
				// State observer using DVL and AHRS data...
				vrxhat = vrx_dvl;
				vryhat = vry_dvl;
				vrzhat = vrz_dvl;
				zhat = z_pressure+hwhat; // Waves influence...
				phihat = phi_ahrs;
				thetahat = theta_ahrs;

				imatrix R_Euler = RotationPhiThetaPsi(phihat, thetahat, psihat);
				box Vr = box(vrxhat, vryhat, vrzhat);
				box pdot = R_Euler*Vr;
				box p = box(xhat, yhat, zhat);
				p = p+dt*pdot;
				xhat = p[1];
				yhat = p[2];

				//imatrix R_Euler = RotationPhiThetaPsi(phihat, thetahat, psihat);
				//box Vr = box(vrxhat, vryhat, vrzhat);
				//rmatrix p = Zeros(3,1);
				//p.SetVal(1, 1, Center(xhat));
				//p.SetVal(2, 1, Center(yhat));
				//p.SetVal(3, 1, Center(zhat));
				//p = p+dt*Center(R_Euler)*rmatrix(Vr);
				//xhat = p.GetVal(1, 1);
				//yhat = p.GetVal(2, 1);
			}
			else
			{
				// State observer (just dead reckoning simulator...).
				xhat = xhat+dt*(vrxhat*Cos(psihat)+vchat*Cos(psichat)+xdotnoise);
				yhat = yhat+dt*(vrxhat*Sin(psihat)+vchat*Sin(psichat)+ydotnoise);
				//zhat = Min(zhat+dt*(u3*alphazhat+vzuphat+zdotnoise),interval(0.0)); // z always negative.
				//zhat = zhat & (z_pressure+hwhat);
				zhat = z_pressure+hwhat; // Waves influence...
				//psihat = psihat+dt*((u1-u2)*alphaomegazhat+psidotnoise);
				phihat = phi_ahrs;
				thetahat = theta_ahrs;
				vrxhat = (
					(1.0-dt*alphafvrxhat)*vrxhat
					+dt*(u1+u2)*alphavrxhat
					+dt*vrxdotnoise
					); // Factorization.
				// Should add vc,psic estimation influence in v?
			}

			// SAUC'ISSE, SARDINE, BLUEROV, LIRMIA3 can measure omegaz.
			if ((robid & SAUCISSE_CLASS_ROBID_MASK)||(robid == BLUEROV_ROBID)||(robid == LIRMIA3_ROBID))
			{
				omegazhat = omegaz_ahrs;
			}
			else if (robid == SUBMARINE_SIMULATOR_ROBID)
			{
				omegazhat = dt*((u1-u2)*alphaomegazhat+psidotnoise); // Why dt*...???

				//omegazhat = (
				//	(1.0-dt*alphafomegazhat)*omegazhat
				//	+dt*(u1-u2)*alphaomegazhat
				//	+dt*omegazdotnoise
				//	); // Factorization.
			}
			else
			{
				// To handle modulo 2pi problems, we should use the following :
				//omegazhat = sin(Center(psihat)-Center(psihat_prev))/dt+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc);

				//GetTimeElapsedChrono(&chrono_omegaz, &dt_chrono);
				//if (dt_chrono > 0.5)
				//{
				//	omegazhat = sin(Center(psihat)-Center(psihat_prev_old))/dt_chrono+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc);
				//	StopChronoQuick(&chrono_omegaz);
				//	StartChrono(&chrono_omegaz);
				//	psihat_prev_old = psihat;
				//}
				omegazhat = 0.8*omegazhat+0.2*(sin(Center(psihat)-Center(psihat_prev))/dt+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc));

				//printf("omegazhat = %f\n", Center(omegazhat));
			}
			if ((bGPSLocalization)&&(bCheckGNSSOK())&&(Center(zhat) > GPS_submarine_depth_limit))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
			}
		}
		else if (robid == ETAS_WHEEL_ROBID)
		{
			xhat = xhat+dt*(alphavrxhat*(u1+u2)*Cos(psihat)+xdotnoise);
			yhat = yhat+dt*(alphavrxhat*(u1+u2)*Sin(psihat)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else if (robid == BUBBLE_ROBID)
		{
			//// Temp...
			//xhat = xhat+dt*(vrxhat*Cos(psihat)+vchat*Cos(psichat)+xdotnoise);
			//yhat = yhat+dt*(vrxhat*Sin(psihat)+vchat*Sin(psichat)+ydotnoise);
			//zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			//vrxhat = (
			//	(1.0-dt*alphafvrxhat)*vrxhat
			//	+dt*(u1+u2)*alphavrxhat
			//	+dt*vrxdotnoise
			//	); // Factorization.
			//// Should add vc,psic estimation influence in v?
			//omegazhat = interval(omegaz_mes-omegaz_ahrs_acc,omegaz_mes+omegaz_ahrs_acc);

			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}
		else if ((robid == BUGGY_SIMULATOR_ROBID)||(robid == BUGGY_ROBID))
		{
			xhat = xhat+dt*(alphavrxhat*u_f*Cos(psihat)*Cos(alphaomegazhat*uw_f)+xdotnoise);
			yhat = yhat+dt*(alphavrxhat*u_f*Sin(psihat)*Cos(alphaomegazhat*uw_f)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else if ((robid == MOTORBOAT_SIMULATOR_ROBID)||(robid == MOTORBOAT_ROBID))
		{
			//// Temp...
			//xhat = xhat+dt*(alphavrxhat*u_f*Cos(psihat)*Cos(alphaomegazhat*uw_f)+xdotnoise);
			//yhat = yhat+dt*(alphavrxhat*u_f*Sin(psihat)*Cos(alphaomegazhat*uw_f)+ydotnoise);
			//zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			//vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			//omegazhat = interval(omegaz_mes-omegaz_ahrs_acc,omegaz_mes+omegaz_ahrs_acc);

			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}
		else if (robid == ARDUCOPTER_ROBID)
		{
			vrxhat = vrx_of;
			vryhat = vry_of;
			xhat = xhat+dt*(vrx_of*Cos(psihat)-vry_of*Sin(psihat)+xdotnoise);
			yhat = yhat+dt*(vrx_of*Sin(psihat)+vry_of*Cos(psihat)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			//vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			vrzhat = (Center(zhat-zhat_prev))/dt+vrzdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else
		{
			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}

		EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &lathat, &longhat, &althat);
		headinghat = fmod_360_pos_rad2deg(-angle_env-Center(psihat)+M_PI/2.0);
		coghat = fmod_360_pos_rad2deg(-angle_env-Center(cog_gps)+M_PI/2.0);

		switch (robid)
		{
		case SUBMARINE_SIMULATOR_ROBID:
		case SAUCISSE_ROBID:
		case SARDINE_ROBID:
		case CISCREA_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u1+u2+u3)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		case VAIMOS_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4+P_actuators_4)/3600.0;
			break;
		case SAILBOAT_SIMULATOR_ROBID:
		case SAILBOAT_ROBID:
		case SAILBOAT2_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*(P_actuators_4)/3600.0;
			break;
		case MOTORBOAT_SIMULATOR_ROBID:
		case MOTORBOAT_ROBID:
		case BUGGY_SIMULATOR_ROBID:
		case BUGGY_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*(u_f*P_actuators_1+uw_f*P_actuators_2+P_actuators_4)/3600.0;
			break;
		case BUBBLE_ROBID:
		case TANK_SIMULATOR_ROBID:
		case ETAS_WHEEL_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u1+u2)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		case QUADRO_SIMULATOR_ROBID:
		case COPTER_ROBID:
		case ARDUCOPTER_ROBID:
		default:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u_f+uw_f+uv_f+ul_f)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		}

		switch (robid)
		{
		case VAIMOS_ROBID:
		case SAILBOAT_ROBID:
		case SAILBOAT2_ROBID:
		case MOTORBOAT_ROBID:
		case BUBBLE_ROBID:
			fluiddira = fmod_360_rad2deg(M_PI/2-psiawind);
			fluidspeeda = vawind;
			fluiddir = fmod_360_rad2deg(M_PI/2-Center(psitwindhat));
			fluidspeed = Center(vtwindhat);
			break;
		case QUADRO_SIMULATOR_ROBID:
		case COPTER_ROBID:
		case ARDUCOPTER_ROBID:
		default:
			break;
		}

		if (logstatefile)
		{
			fprintf(logstatefile,
				"%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;\n",
				t_epoch, lathat, longhat, althat, headinghat, coghat, sog, altitude_AGL, pressure_mes, fluiddira, fluidspeeda, fluiddir, fluidspeed, d_mes, fmod_360_rad2deg(alpha_mes), 0.0, utc,
				t, Center(xhat), Center(yhat), Center(zhat), Center(phihat), Center(thetahat), Center(psihat),
				Center(vrxhat), Center(vryhat), Center(vrzhat), Center(omegaxhat), Center(omegayhat), Center(omegazhat), Center(accrxhat), Center(accryhat), Center(accrzhat),
				Width(xhat/2.0), Width(yhat/2.0), Width(zhat/2.0), Width(phihat/2.0), Width(thetahat/2.0), Width(psihat/2.0),
				Width(vrxhat/2.0), Width(vryhat/2.0), Width(vrzhat/2.0), Width(omegaxhat/2.0), Width(omegayhat/2.0), Width(omegazhat/2.0), Width(accrxhat/2.0), Width(accryhat/2.0), Width(accrzhat/2.0),
				wx, wy, wz, wphi, wtheta, wpsi, wd, wu, wagl,
				u_f, ul_f, uv_f, ur_f, up_f, uw_f, u1, u2, u3, u4, u5, u6, u7, u8, u9, u10, u11, u12, u13, u14,
				EPU1, EPU2);
			fflush(logstatefile);
		}

		LeaveCriticalSection(&StateVariablesCS);

		if (bExit) break;
	}

	StopChronoQuick(&chrono_omegaz);
	StopChronoQuick(&chrono_v);
	StopChrono(&chrono, &t);

	if (logstatefile)
	{
		fclose(logstatefile);
	}

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}